

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::MakeIfdefGuardIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view header_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type in_R9;
  FixedMapping replacements;
  string_view s;
  string result;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  AlphaNum local_e0;
  AlphaNum *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  char local_80 [8];
  char *local_78;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  
  s._M_len = header_path._M_len;
  local_80[0] = '\x01';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  local_80[4] = '\0';
  local_80[5] = '\0';
  local_80[6] = '\0';
  local_80[7] = '\0';
  local_78 = "/";
  local_70 = 1;
  local_68 = "_";
  local_60 = 1;
  local_58 = ".";
  local_50 = 1;
  local_48 = "_";
  local_40 = 1;
  local_38 = "-";
  local_30 = 1;
  local_28 = "_";
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x3;
  s._M_str = local_80;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_120,(lts_20250127 *)this,s,replacements);
  paVar1 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p == paVar1) {
    local_100.field_2._8_8_ = local_120.field_2._8_8_;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100._M_dataplus._M_p = local_120._M_dataplus._M_p;
  }
  local_100.field_2._M_allocated_capacity._1_7_ = local_120.field_2._M_allocated_capacity._1_7_;
  local_100.field_2._M_local_buf[0] = local_120.field_2._M_local_buf[0];
  local_100._M_string_length = local_120._M_string_length;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)paVar1;
  absl::lts_20250127::AsciiStrToUpper(&local_100);
  local_b0 = (AlphaNum *)local_100._M_string_length;
  local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_100._M_dataplus._M_p;
  local_e0.piece_._M_len = 1;
  local_e0.piece_._M_str = "_";
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_b0,&local_e0,
             (AlphaNum *)local_100._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MakeIfdefGuardIdentifier(const absl::string_view header_path) {
  return absl::StrCat(absl::AsciiStrToUpper(absl::StrReplaceAll(header_path,
                                                                {
                                                                    {"/", "_"},
                                                                    {".", "_"},
                                                                    {"-", "_"},
                                                                })),
                      "_");
}